

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack19_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  *out = (*in & 0x7ffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x13;
  out[1] = (uVar1 >> 0x13) + base + (in[1] & 0x3f) * 0x2000;
  out[2] = (in[1] >> 6 & 0x7ffff) + base;
  uVar1 = in[1];
  out[3] = uVar1 >> 0x19;
  out[3] = (uVar1 >> 0x19) + base + (in[2] & 0xfff) * 0x80;
  out[4] = (in[2] >> 0xc & 0x7ffff) + base;
  uVar2 = in[2];
  out[5] = -((int)uVar2 >> 0x1f);
  out[5] = -((int)uVar2 >> 0x1f) + base + (in[3] & 0x3ffff) * 2;
  uVar1 = in[3];
  out[6] = uVar1 >> 0x12;
  out[6] = (uVar1 >> 0x12) + base + (in[4] & 0x1f) * 0x4000;
  out[7] = (in[4] >> 5 & 0x7ffff) + base;
  return in + 5;
}

Assistant:

uint32_t * unpack19_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 19 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 19 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 19 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  25  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 19 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 19 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 19 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 5 ))<<( 19 - 5 );
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   % (1U << 19 )  ;
    *out += base;
    out++;

    return in + 1;
}